

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O0

void arena_postfork_child(tsdn_t *tsdn,arena_t *arena)

{
  arena_t *in_RSI;
  long in_RDI;
  uint j;
  tcache_t *tcache;
  uint i;
  uint8_t state;
  uint8_t state_2;
  uint8_t state_1;
  uint8_t state_3;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 uVar1;
  atomic_u_t *tsdn_00;
  uint uStack_124;
  uint uStack_114;
  tcache_t *ptStack_b0;
  
  in_RSI->nthreads[0].repr = 0;
  tsdn_00 = in_RSI->nthreads + 1;
  uVar1 = 0;
  tsdn_00->repr = 0;
  if (*(arena_t **)(in_RDI + 0x1b8) == in_RSI) {
    arena_nthreads_inc(in_RSI,false);
  }
  if (*(arena_t **)(in_RDI + 0x1b0) == in_RSI) {
    arena_nthreads_inc(in_RSI,true);
  }
  (in_RSI->tcache_ql).qlh_first = (tcache_t *)0x0;
  (in_RSI->cache_bin_array_descriptor_ql).qlh_first = (cache_bin_array_descriptor_t *)0x0;
  if ((*(byte *)(in_RDI + 1) & 1) == 0) {
    ptStack_b0 = (tcache_t *)0x0;
  }
  else {
    ptStack_b0 = (tcache_t *)(in_RDI + 0x1f0);
  }
  if ((ptStack_b0 != (tcache_t *)0x0) && (ptStack_b0->arena == in_RSI)) {
    (ptStack_b0->link).qre_next = ptStack_b0;
    (ptStack_b0->link).qre_prev = ptStack_b0;
    if ((in_RSI->tcache_ql).qlh_first != (tcache_t *)0x0) {
      (ptStack_b0->link).qre_prev = (((in_RSI->tcache_ql).qlh_first)->link).qre_prev;
      (ptStack_b0->link).qre_next = (in_RSI->tcache_ql).qlh_first;
      (((ptStack_b0->link).qre_prev)->link).qre_next = ptStack_b0;
      (((in_RSI->tcache_ql).qlh_first)->link).qre_prev = ptStack_b0;
    }
    (in_RSI->tcache_ql).qlh_first = (ptStack_b0->link).qre_next;
    cache_bin_array_descriptor_init
              (&ptStack_b0->cache_bin_array_descriptor,ptStack_b0->bins_small,ptStack_b0->bins_large
              );
    if ((in_RSI->cache_bin_array_descriptor_ql).qlh_first != (cache_bin_array_descriptor_t *)0x0) {
      (ptStack_b0->cache_bin_array_descriptor).link.qre_prev =
           (((in_RSI->cache_bin_array_descriptor_ql).qlh_first)->link).qre_prev;
      (ptStack_b0->cache_bin_array_descriptor).link.qre_next =
           (in_RSI->cache_bin_array_descriptor_ql).qlh_first;
      (((ptStack_b0->cache_bin_array_descriptor).link.qre_prev)->link).qre_next =
           &ptStack_b0->cache_bin_array_descriptor;
      (((in_RSI->cache_bin_array_descriptor_ql).qlh_first)->link).qre_prev =
           &ptStack_b0->cache_bin_array_descriptor;
    }
    (in_RSI->cache_bin_array_descriptor_ql).qlh_first =
         (ptStack_b0->cache_bin_array_descriptor).link.qre_next;
  }
  for (uStack_114 = 0; uStack_114 < 0x24; uStack_114 = uStack_114 + 1) {
    for (uStack_124 = 0; uStack_124 < bin_infos[uStack_114].n_shards; uStack_124 = uStack_124 + 1) {
      func_0x0010ea40(in_RDI,in_RSI->bins[uStack_114].bin_shards + uStack_124);
    }
  }
  malloc_mutex_postfork_child
            ((tsdn_t *)tsdn_00,(malloc_mutex_t *)CONCAT44(uVar1,in_stack_fffffffffffffea8));
  func_0x0010e660(in_RDI,in_RSI->base);
  malloc_mutex_postfork_child
            ((tsdn_t *)tsdn_00,(malloc_mutex_t *)CONCAT44(uVar1,in_stack_fffffffffffffea8));
  func_0x0010ee00(in_RDI,&in_RSI->extents_dirty);
  func_0x0010ee00(in_RDI,&in_RSI->extents_muzzy);
  func_0x0010ee00(in_RDI,&in_RSI->extents_retained);
  malloc_mutex_postfork_child
            ((tsdn_t *)tsdn_00,(malloc_mutex_t *)CONCAT44(uVar1,in_stack_fffffffffffffea8));
  malloc_mutex_postfork_child
            ((tsdn_t *)tsdn_00,(malloc_mutex_t *)CONCAT44(uVar1,in_stack_fffffffffffffea8));
  malloc_mutex_postfork_child
            ((tsdn_t *)tsdn_00,(malloc_mutex_t *)CONCAT44(uVar1,in_stack_fffffffffffffea8));
  malloc_mutex_postfork_child
            ((tsdn_t *)tsdn_00,(malloc_mutex_t *)CONCAT44(uVar1,in_stack_fffffffffffffea8));
  return;
}

Assistant:

void
arena_postfork_child(tsdn_t *tsdn, arena_t *arena) {
	unsigned i;

	atomic_store_u(&arena->nthreads[0], 0, ATOMIC_RELAXED);
	atomic_store_u(&arena->nthreads[1], 0, ATOMIC_RELAXED);
	if (tsd_arena_get(tsdn_tsd(tsdn)) == arena) {
		arena_nthreads_inc(arena, false);
	}
	if (tsd_iarena_get(tsdn_tsd(tsdn)) == arena) {
		arena_nthreads_inc(arena, true);
	}
	if (config_stats) {
		ql_new(&arena->tcache_ql);
		ql_new(&arena->cache_bin_array_descriptor_ql);
		tcache_t *tcache = tcache_get(tsdn_tsd(tsdn));
		if (tcache != NULL && tcache->arena == arena) {
			ql_elm_new(tcache, link);
			ql_tail_insert(&arena->tcache_ql, tcache, link);
			cache_bin_array_descriptor_init(
			    &tcache->cache_bin_array_descriptor,
			    tcache->bins_small, tcache->bins_large);
			ql_tail_insert(&arena->cache_bin_array_descriptor_ql,
			    &tcache->cache_bin_array_descriptor, link);
		}
	}

	for (i = 0; i < SC_NBINS; i++) {
		for (unsigned j = 0; j < bin_infos[i].n_shards; j++) {
			bin_postfork_child(tsdn, &arena->bins[i].bin_shards[j]);
		}
	}
	malloc_mutex_postfork_child(tsdn, &arena->large_mtx);
	base_postfork_child(tsdn, arena->base);
	malloc_mutex_postfork_child(tsdn, &arena->extent_avail_mtx);
	extents_postfork_child(tsdn, &arena->extents_dirty);
	extents_postfork_child(tsdn, &arena->extents_muzzy);
	extents_postfork_child(tsdn, &arena->extents_retained);
	malloc_mutex_postfork_child(tsdn, &arena->extent_grow_mtx);
	malloc_mutex_postfork_child(tsdn, &arena->decay_dirty.mtx);
	malloc_mutex_postfork_child(tsdn, &arena->decay_muzzy.mtx);
	if (config_stats) {
		malloc_mutex_postfork_child(tsdn, &arena->tcache_ql_mtx);
	}
}